

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

int Bac_ManExtract_rec(Gia_Man_t *pNew,Bac_Ntk_t *p,int i,int fBuffers,Vec_Int_t *vMap)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  void **ppvVar4;
  Dec_Graph_t *pFForm;
  Bac_Man_t *p_00;
  uint uVar5;
  Bac_ObjType_t BVar6;
  int iVar7;
  int iRNtk;
  int iVar8;
  uint i_00;
  Bac_Ntk_t *p_01;
  long lVar9;
  int pLits [16];
  Vec_Int_t Leaves;
  
  if ((i < 0) || ((p->vCopy).nSize <= i)) goto LAB_008aac70;
  iVar8 = (p->vCopy).pArray[(uint)i];
  if (-1 < iVar8) {
    return iVar8;
  }
  uVar5 = (p->vType).nSize;
  if ((int)uVar5 <= i) {
LAB_008aac8f:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  pcVar3 = (p->vType).pArray;
  bVar1 = pcVar3[(uint)i];
  if ((bVar1 & 0xfc) == 4) {
    if ((p->vFanin).nSize <= i) goto LAB_008aac70;
    uVar5 = Bac_ManExtract_rec(pNew,p,(p->vFanin).pArray[(uint)i],fBuffers,vMap);
    goto LAB_008aaa2b;
  }
  if ((bVar1 & 0xfe) != 8) {
    if ((bVar1 & 0xfe) != 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0xd4,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    iVar8 = p->iBoxNtk;
    if (((long)iVar8 < 1) || (p->pDesign->nNtks < iVar8)) {
      p_01 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_01 = p->pDesign->pNtks + iVar8;
    }
    if (9 < bVar1) {
      __assert_fail("Bac_ObjIsCio(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x11e,"int Bac_ObjIndex(Bac_Ntk_t *, int)");
    }
    if ((p->vIndex).nSize <= i) goto LAB_008aac70;
    uVar5 = p->iBoxObj;
    if (((int)uVar5 < 0) || ((p_01->vType).nSize <= (int)uVar5)) goto LAB_008aac8f;
    if (((byte)(p_01->vType).pArray[uVar5] >> 1) - 0x49 < 0xffffffbc) {
LAB_008aacae:
      __assert_fail("Bac_ObjIsBox(p, b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x133,"int Bac_BoxBi(Bac_Ntk_t *, int, int)");
    }
    iVar8 = ~(p->vIndex).pArray[(uint)i] + uVar5;
LAB_008aa9ab:
    uVar5 = Bac_ManExtract_rec(pNew,p_01,iVar8,fBuffers,vMap);
    if (fBuffers != 0) {
      p_00 = p->pDesign;
      iVar7 = (int)((ulong)((long)p - (long)p_00->pNtks) >> 4) * -0x3b13b13b;
      if ((iVar7 < 1) || (p_00->nNtks < iVar7)) {
LAB_008aaccd:
        __assert_fail("Bac_ManNtkIsOk(p->pDesign, i)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                      ,0xd2,"int Bac_NtkId(Bac_Ntk_t *)");
      }
      iRNtk = (int)((ulong)((long)p_01 - (long)p_01->pDesign->pNtks) >> 4) * -0x3b13b13b;
      if ((iRNtk < 1) || (p_01->pDesign->nNtks < iRNtk)) goto LAB_008aaccd;
      uVar5 = Bac_ManAddBarbuf(pNew,uVar5,p_00,iVar7,i,iRNtk,iVar8,vMap);
    }
    goto LAB_008aaa2b;
  }
  if ((p->vIndex).nSize <= i) goto LAB_008aac70;
  uVar2 = (p->vIndex).pArray[(uint)i];
  i_00 = ~uVar2 + i;
  if (((int)i_00 < 0) || (uVar5 <= i_00)) goto LAB_008aac8f;
  if ((pcVar3[i_00] & 0xfeU) == 10) {
    if ((p->vFanin).nSize <= (int)i_00) goto LAB_008aac70;
    iVar8 = (p->vFanin).pArray[i_00];
    if (((long)iVar8 < 1) || (p->pDesign->nNtks < iVar8)) {
      p_01 = (Bac_Ntk_t *)0x0;
    }
    else {
      p_01 = p->pDesign->pNtks + iVar8;
    }
    if (((int)uVar2 < 0) || ((p_01->vOutputs).nSize <= (int)uVar2)) goto LAB_008aac70;
    iVar8 = (p_01->vOutputs).pArray[uVar2];
    goto LAB_008aa9ab;
  }
  iVar8 = Bac_ObjIsBoxPrim(p,i_00);
  if (iVar8 == 0) {
    __assert_fail("Bac_ObjIsBoxPrim(p, iBox)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x8a,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
  if (i_00 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = i_00 - 1;
    lVar9 = 0;
    do {
      iVar8 = (p->vType).nSize;
      if (iVar8 <= (int)uVar5) goto LAB_008aac8f;
      pcVar3 = (p->vType).pArray;
      if ((pcVar3[uVar5] & 0xfeU) != 6) break;
      if (iVar8 <= (int)i_00) goto LAB_008aac8f;
      if (((byte)pcVar3[i_00] >> 1) - 0x49 < 0xffffffbc) goto LAB_008aacae;
      if ((p->vFanin).nSize <= (int)uVar5) goto LAB_008aac70;
      iVar8 = Bac_ManExtract_rec(pNew,p,(p->vFanin).pArray[uVar5],fBuffers,vMap);
      pLits[lVar9] = iVar8;
      lVar9 = lVar9 + 1;
      uVar5 = uVar5 - 1;
    } while (-1 < (int)uVar5);
    uVar5 = (uint)lVar9;
    if (0x10 < uVar5) {
      __assert_fail("nLits <= 16",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0x8d,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
  }
  ppvVar4 = p->pDesign->ppGraphs;
  if (ppvVar4 != (void **)0x0) {
    iVar8 = Bac_BoxNtkId(p,i_00);
    pFForm = (Dec_Graph_t *)ppvVar4[iVar8];
    Leaves.pArray = pLits;
    Leaves.nCap = uVar5;
    Leaves.nSize = uVar5;
    if (pFForm != (Dec_Graph_t *)0x0) {
      iVar8 = Gia_ManFactorGraph(pNew,pFForm,&Leaves);
      return iVar8;
    }
    __assert_fail("pGraph != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0x93,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
  BVar6 = Bac_ObjType(p,i_00);
  switch(uVar5) {
  case 0:
    uVar5 = 0;
    if (BVar6 != BAC_BOX_CF) {
      if (BVar6 != BAC_BOX_CT) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0x9f,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      uVar5 = 1;
    }
    break;
  case 1:
    if (BVar6 == BAC_BOX_INV) goto joined_r0x008aac41;
    uVar5 = pLits[0];
    if (BVar6 != BAC_BOX_BUF) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0xa7,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
    break;
  case 2:
    switch(BVar6) {
    case BAC_BOX_AND:
      goto LAB_008aac66;
    case BAC_BOX_NAND:
      pLits[0] = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
      break;
    case BAC_BOX_OR:
LAB_008aabf5:
      uVar5 = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
      goto LAB_008aaa2b;
    case BAC_BOX_NOR:
      pLits[0] = Gia_ManHashOr(pNew,pLits[0],pLits[1]);
      break;
    case BAC_BOX_XOR:
      uVar5 = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
      goto LAB_008aaa2b;
    case BAC_BOX_XNOR:
      pLits[0] = Gia_ManHashXor(pNew,pLits[0],pLits[1]);
      break;
    case BAC_BOX_SHARP:
      if (pLits[1] < 0) goto LAB_008aada6;
      pLits[1] = pLits[1] ^ 1;
      goto LAB_008aac66;
    case BAC_BOX_SHARPL:
      if (pLits[0] < 0) goto LAB_008aada6;
      pLits[0] = pLits[0] ^ 1;
LAB_008aac66:
      uVar5 = Gia_ManHashAnd(pNew,pLits[0],pLits[1]);
      goto LAB_008aaa2b;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                    ,0xbb,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)")
      ;
    }
joined_r0x008aac41:
    if (pLits[0] < 0) {
LAB_008aada6:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    uVar5 = pLits[0] ^ 1;
    break;
  case 3:
    if (BVar6 == BAC_BOX_ADD) {
      uVar5 = Gia_ManHashAnd(pNew,pLits[1],pLits[2]);
      iVar8 = Gia_ManHashOr(pNew,pLits[1],pLits[2]);
      iVar7 = Bac_BoxBoNum(p,i_00);
      if (iVar7 != 2) {
        __assert_fail("Bac_BoxBoNum(p, iBox) == 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,199,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)"
                     );
      }
      iVar7 = Bac_BoxBo(p,i_00,0);
      if (iVar7 != i) {
        iVar7 = Bac_BoxBo(p,i_00,1);
        if (iVar7 != i) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                        ,0xcc,
                        "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
        }
        pLits[1] = Gia_ManHashAnd(pNew,pLits[0],iVar8);
        pLits[0] = uVar5;
        goto LAB_008aabf5;
      }
      if ((int)uVar5 < 0) goto LAB_008aada6;
      iVar8 = Gia_ManHashAnd(pNew,uVar5 ^ 1,iVar8);
      uVar5 = Gia_ManHashXor(pNew,pLits[0],iVar8);
    }
    else if (BVar6 == BAC_BOX_MAJ) {
      uVar5 = Gia_ManHashMaj(pNew,pLits[0],pLits[1],pLits[2]);
    }
    else {
      if (BVar6 != BAC_BOX_MUX) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                      ,0xce,
                      "int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
      }
      uVar5 = Gia_ManHashMux(pNew,pLits[0],pLits[1],pLits[2]);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacBlast.c"
                  ,0xd0,"int Bac_ManExtract_rec(Gia_Man_t *, Bac_Ntk_t *, int, int, Vec_Int_t *)");
  }
LAB_008aaa2b:
  if (i < (p->vCopy).nSize) {
    if ((p->vCopy).pArray[(uint)i] != -1) {
      __assert_fail("Bac_ObjCopy(p, i) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                    ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
    }
    Vec_IntFillExtra(&p->vCopy,i + 1,0);
    if (i < (p->vCopy).nSize) {
      (p->vCopy).pArray[(uint)i] = uVar5;
      return uVar5;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_008aac70:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Bac_ManExtract_rec( Gia_Man_t * pNew, Bac_Ntk_t * p, int i, int fBuffers, Vec_Int_t * vMap )
{
    int iRes = Bac_ObjCopy( p, i );
    if ( iRes >= 0 )
        return iRes;
    if ( Bac_ObjIsCo(p, i) )
        iRes = Bac_ManExtract_rec( pNew, p, Bac_ObjFanin(p, i), fBuffers, vMap );
    else if ( Bac_ObjIsPi(p, i) )
    {
        Bac_Ntk_t * pHost = Bac_NtkHostNtk( p );
        int iObj = Bac_BoxBi( pHost, Bac_NtkHostObj(p), Bac_ObjIndex(p, i) );
        iRes = Bac_ManExtract_rec( pNew, pHost, iObj, fBuffers, vMap );
        if ( fBuffers )
            iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pHost), iObj, vMap );
    }
    else if ( Bac_ObjIsBo(p, i) )
    {
        int iBox = Bac_BoxBoBox(p, i);
        if ( Bac_ObjIsBoxUser(p, iBox) ) // user box
        {
            Bac_Ntk_t * pBox = Bac_BoxBoNtk( p, i );
            int iObj = Bac_NtkPo( pBox, Bac_ObjIndex(p, i) );
            iRes = Bac_ManExtract_rec( pNew, pBox, iObj, fBuffers, vMap );
            if ( fBuffers )
                iRes = Bac_ManAddBarbuf( pNew, iRes, p->pDesign, Bac_NtkId(p), i, Bac_NtkId(pBox), iObj, vMap );
        }
        else // primitive
        {
            int iFanin, nLits, pLits[16];
            assert( Bac_ObjIsBoxPrim(p, iBox) );
            Bac_BoxForEachFanin( p, iBox, iFanin, nLits )
                pLits[nLits] = Bac_ManExtract_rec( pNew, p, iFanin, fBuffers, vMap );
            assert( nLits <= 16 );
            if ( p->pDesign->ppGraphs ) // mapped gate
            {
                extern int Gia_ManFactorGraph( Gia_Man_t * p, Dec_Graph_t * pFForm, Vec_Int_t * vLeaves );
                Dec_Graph_t * pGraph = (Dec_Graph_t *)p->pDesign->ppGraphs[Bac_BoxNtkId(p, iBox)];
                Vec_Int_t Leaves = { nLits, nLits, pLits };
                assert( pGraph != NULL );
                return Gia_ManFactorGraph( pNew, pGraph, &Leaves );
            }
            else
            {
                Bac_ObjType_t Type = Bac_ObjType(p, iBox);
                if ( nLits == 0 )
                {
                    if ( Type == BAC_BOX_CF )
                        iRes = 0;
                    else if ( Type == BAC_BOX_CT )
                        iRes = 1;
                    else assert( 0 );
                }
                else if ( nLits == 1 )
                {
                    if ( Type == BAC_BOX_BUF )
                        iRes = pLits[0];
                    else if ( Type == BAC_BOX_INV )
                        iRes = Abc_LitNot( pLits[0] );
                    else assert( 0 );
                }
                else if ( nLits == 2 )
                {
                    if ( Type == BAC_BOX_AND )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NAND )
                        iRes = Abc_LitNot( Gia_ManHashAnd( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_OR )
                        iRes = Gia_ManHashOr( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_NOR )
                        iRes = Abc_LitNot( Gia_ManHashOr( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_XOR )
                        iRes = Gia_ManHashXor( pNew, pLits[0], pLits[1] );
                    else if ( Type == BAC_BOX_XNOR )
                        iRes = Abc_LitNot( Gia_ManHashXor( pNew, pLits[0], pLits[1] ) );
                    else if ( Type == BAC_BOX_SHARP )
                        iRes = Gia_ManHashAnd( pNew, pLits[0], Abc_LitNot(pLits[1]) );
                    else if ( Type == BAC_BOX_SHARPL )
                        iRes = Gia_ManHashAnd( pNew, Abc_LitNot(pLits[0]), pLits[1] );
                    else assert( 0 );
                }
                else if ( nLits == 3 )
                {
                    if ( Type == BAC_BOX_MUX )
                        iRes = Gia_ManHashMux( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_MAJ )
                        iRes = Gia_ManHashMaj( pNew, pLits[0], pLits[1], pLits[2] );
                    else if ( Type == BAC_BOX_ADD )
                    {
                        int iRes0 = Gia_ManHashAnd( pNew, pLits[1], pLits[2] );
                        int iRes1 = Gia_ManHashOr( pNew, pLits[1], pLits[2] );
                        assert( Bac_BoxBoNum(p, iBox) == 2 );
                        if ( Bac_BoxBo(p, iBox, 0) == i ) // sum
                            iRes = Gia_ManHashXor( pNew, pLits[0], Gia_ManHashAnd(pNew, Abc_LitNot(iRes0), iRes1) );
                        else if ( Bac_BoxBo(p, iBox, 1) == i ) // cout
                            iRes = Gia_ManHashOr( pNew, iRes0, Gia_ManHashAnd(pNew, pLits[0], iRes1) );
                        else assert( 0 );
                    }
                    else assert( 0 );
                }
                else assert( 0 );
            }
        }
    }
    else assert( 0 );
    Bac_ObjSetCopy( p, i, iRes );
    return iRes;
}